

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QKeyCombination>::emplace<QKeyCombination_const&>
          (QMovableArrayOps<QKeyCombination> *this,qsizetype i,QKeyCombination *args)

{
  qsizetype *pqVar1;
  int iVar2;
  Data *pDVar3;
  long lVar4;
  qsizetype qVar5;
  QKeyCombination *pQVar6;
  long in_FS_OFFSET;
  bool bVar7;
  Inserter local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QKeyCombination>).super_QArrayDataPointer<QKeyCombination>.
           d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_003e21eb:
    iVar2 = args->combination;
    bVar7 = (this->super_QGenericArrayOps<QKeyCombination>).super_QArrayDataPointer<QKeyCombination>
            .size != 0;
    QArrayDataPointer<QKeyCombination>::detachAndGrow
              ((QArrayDataPointer<QKeyCombination> *)this,(uint)(i == 0 && bVar7),1,
               (QKeyCombination **)0x0,(QArrayDataPointer<QKeyCombination> *)0x0);
    if (i != 0 || !bVar7) {
      Inserter::Inserter(&local_58,(QArrayDataPointer<QKeyCombination> *)this,i,1);
      (local_58.displaceFrom)->combination = iVar2;
      (local_58.data)->size = (local_58.data)->size + local_58.nInserts;
      goto LAB_003e2255;
    }
    pQVar6 = (this->super_QGenericArrayOps<QKeyCombination>).
             super_QArrayDataPointer<QKeyCombination>.ptr;
    pQVar6[-1].combination = iVar2;
  }
  else {
    if ((this->super_QGenericArrayOps<QKeyCombination>).super_QArrayDataPointer<QKeyCombination>.
        size == i) {
      qVar5 = QArrayDataPointer<QKeyCombination>::freeSpaceAtEnd
                        ((QArrayDataPointer<QKeyCombination> *)this);
      if (qVar5 != 0) {
        lVar4 = (this->super_QGenericArrayOps<QKeyCombination>).
                super_QArrayDataPointer<QKeyCombination>.size;
        (this->super_QGenericArrayOps<QKeyCombination>).super_QArrayDataPointer<QKeyCombination>.ptr
        [lVar4].combination = args->combination;
        (this->super_QGenericArrayOps<QKeyCombination>).super_QArrayDataPointer<QKeyCombination>.
        size = lVar4 + 1;
        goto LAB_003e2255;
      }
    }
    if (i != 0) goto LAB_003e21eb;
    qVar5 = QArrayDataPointer<QKeyCombination>::freeSpaceAtBegin
                      ((QArrayDataPointer<QKeyCombination> *)this);
    if (qVar5 == 0) goto LAB_003e21eb;
    pQVar6 = (this->super_QGenericArrayOps<QKeyCombination>).
             super_QArrayDataPointer<QKeyCombination>.ptr;
    pQVar6[-1].combination = args->combination;
  }
  (this->super_QGenericArrayOps<QKeyCombination>).super_QArrayDataPointer<QKeyCombination>.ptr =
       pQVar6 + -1;
  pqVar1 = &(this->super_QGenericArrayOps<QKeyCombination>).super_QArrayDataPointer<QKeyCombination>
            .size;
  *pqVar1 = *pqVar1 + 1;
LAB_003e2255:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }